

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

void Am_Standard_Open_From_Filename(Am_Object *command_obj,Am_String *filename)

{
  bool bVar1;
  char *pcVar2;
  Am_Value_List *pAVar3;
  Am_Value *value;
  ostream *poVar4;
  Am_Value contents;
  Am_Object local_270;
  Am_Value_List loaded;
  Am_String local_258;
  Am_Value_List local_250;
  Am_Value_List local_240;
  Am_Handle_Loaded_Items_Method method;
  ifstream in_file;
  byte abStack_200 [488];
  
  Am_String::Am_String(&local_258,filename);
  remove_extra_quotes((Am_String *)&in_file);
  Am_String::operator=(filename,(Am_String *)&in_file);
  Am_String::~Am_String((Am_String *)&in_file);
  Am_String::~Am_String(&local_258);
  set_default_filename(command_obj,filename);
  pcVar2 = Am_String::operator_cast_to_char_(filename);
  std::ifstream::ifstream(&in_file,pcVar2,_S_in);
  if ((abStack_200[*(long *)(_in_file + -0x18)] & 5) != 0) {
    Am_Value_List::Am_Value_List((Am_Value_List *)&contents);
    pAVar3 = Am_Value_List::Add((Am_Value_List *)&contents,"File could not be opened:",Am_TAIL,true)
    ;
    pAVar3 = Am_Value_List::Add(pAVar3,filename,Am_TAIL,true);
    Am_Value_List::Am_Value_List(&local_240,pAVar3);
    Am_Show_Alert_Dialog(&local_240,-10000,-10000,true);
    Am_Value_List::~Am_Value_List(&local_240);
    Am_Value_List::~Am_Value_List((Am_Value_List *)&contents);
    goto LAB_00243f29;
  }
  Am_Load_Save_Context::Reset(&Am_Default_Load_Save_Context);
  Am_Load_Save_Context::Load
            ((Am_Load_Save_Context *)&contents,(istream *)&Am_Default_Load_Save_Context);
  bVar1 = Am_Value::Valid(&contents);
  if (bVar1) {
    bVar1 = Am_Value_List::Test(&contents);
    if (!bVar1) goto LAB_00243eb7;
    Am_Value_List::Am_Value_List(&loaded,&contents);
    value = Am_Object::Get(command_obj,0x19b,0);
    Am_Handle_Loaded_Items_Method::Am_Handle_Loaded_Items_Method(&method,value);
    if (method.Call == (Am_Handle_Loaded_Items_Method_Type *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar4 = std::operator<<(poVar4,"Open Command ");
      poVar4 = operator<<(poVar4,command_obj);
      poVar4 = std::operator<<(poVar4," must have a method in Am_HANDLE_OPEN_SAVE_METHOD slot");
      std::endl<char,std::char_traits<char>>(poVar4);
      Am_Error();
    }
    Am_Object::Am_Object(&local_270,command_obj);
    (*method.Call)((Am_Object_Data *)&local_270,&loaded);
    Am_Object::~Am_Object(&local_270);
  }
  else {
LAB_00243eb7:
    Am_Value_List::Am_Value_List(&loaded);
    pAVar3 = Am_Value_List::Add(&loaded,"File does not contain valid data:",Am_TAIL,true);
    pAVar3 = Am_Value_List::Add(pAVar3,filename,Am_TAIL,true);
    Am_Value_List::Am_Value_List(&local_250,pAVar3);
    Am_Show_Alert_Dialog(&local_250,-10000,-10000,true);
    Am_Value_List::~Am_Value_List(&local_250);
  }
  Am_Value_List::~Am_Value_List(&loaded);
  Am_Value::~Am_Value(&contents);
LAB_00243f29:
  std::ifstream::~ifstream(&in_file);
  return;
}

Assistant:

void
Am_Standard_Open_From_Filename(Am_Object command_obj, Am_String filename)
{
  filename = remove_extra_quotes(filename);
  set_default_filename(command_obj, filename);
  std::ifstream in_file((const char *)filename, std::ios::in);
  if (!in_file) {
    Am_Show_Alert_Dialog(
        Am_Value_List().Add("File could not be opened:").Add(filename));
    return;
  }
  Am_Default_Load_Save_Context.Reset();
  Am_Value contents = Am_Default_Load_Save_Context.Load(in_file);
  if (!contents.Valid() || !Am_Value_List::Test(contents)) {
    Am_Show_Alert_Dialog(
        Am_Value_List().Add("File does not contain valid data:").Add(filename));
    return;
  }
  Am_Value_List loaded = contents;
  Am_Handle_Loaded_Items_Method method =
      command_obj.Get(Am_HANDLE_OPEN_SAVE_METHOD);
  if (method.Valid())
    method.Call(command_obj, loaded);
  else
    Am_ERRORO("Open Command "
                  << command_obj
                  << " must have a method in Am_HANDLE_OPEN_SAVE_METHOD slot",
              command_obj, Am_HANDLE_OPEN_SAVE_METHOD);
}